

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yield_token_conversion.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  count_type cVar3;
  stack_context *psVar4;
  stack_context sVar5;
  int local_34;
  fiber local_30;
  io_context io;
  basic_fixedsize_stack<boost::context::stack_traits> local_18;
  
  local_34 = 0;
  boost::asio::io_context::io_context(&io);
  local_18.size_ = boost::context::stack_traits::default_size();
  sVar5 = boost::context::basic_fixedsize_stack<boost::context::stack_traits>::allocate(&local_18);
  psVar4 = (stack_context *)((long)sVar5.sp - 0x30U & 0xffffffffffffff00);
  *psVar4 = sVar5;
  psVar4[1].size = local_18.size_;
  psVar4[1].sp = &local_34;
  psVar4[2].size = (size_t)&io;
  *(undefined4 *)((long)&psVar4[2].sp + 4) = 0;
  lVar2 = make_fcontext(psVar4 + -4,(long)psVar4 + (sVar5.size - (long)sVar5.sp) + -0x40,
                        boost::context::detail::
                        fiber_entry<boost::context::detail::fiber_record<boost::context::fiber,boost::context::basic_fixedsize_stack<boost::context::stack_traits>,ufiber::detail::fiber_main<main::__0,boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,ufiber::broken_promise>>>
                       );
  if (lVar2 != 0) {
    local_30.fctx_ = (fcontext_t)jump_fcontext(lVar2,psVar4);
    ufiber::detail::initial_resume(&local_30);
    boost::context::fiber::~fiber(&local_30);
    cVar3 = boost::asio::io_context::run(&io);
    boost::detail::test_impl
              ("io.run() > 0",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
               ,0x29,"int main()",cVar3 != 0);
    boost::detail::test_impl
              ("count == 3",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
               ,0x2a,"int main()",local_34 == 3);
    iVar1 = boost::report_errors();
    boost::asio::execution_context::~execution_context(&io.super_execution_context);
    return iVar1;
  }
  __assert_fail("nullptr != fctx","/usr/include/boost/context/fiber_fcontext.hpp",0xac,
                "fcontext_t boost::context::detail::create_fiber1(StackAlloc &&, Fn &&) [Record = boost::context::detail::fiber_record<boost::context::fiber, boost::context::basic_fixedsize_stack<boost::context::stack_traits>, ufiber::detail::fiber_main<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7), boost::asio::io_context::basic_executor_type<std::allocator<void>, 0>>>, StackAlloc = boost::context::basic_fixedsize_stack<boost::context::stack_traits>, Fn = ufiber::detail::fiber_main<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7), boost::asio::io_context::basic_executor_type<std::allocator<void>, 0>>]"
               );
}

Assistant:

int
main()
{
    // Check if it's possible to do yield_token conversions (e.g. to type erase
    // the executor)
    int count = 0;
    auto f =
      [&](ufiber::yield_token<boost::asio::io_context::executor_type> y) {
          ++count;
          ufiber::yield_token<boost::asio::io_context::executor_type> yield{y};
          // Check we don't get spawned into the system executor by accident
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          boost::asio::post(yield);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
          ufiber::yield_token<boost::asio::executor> yield2{y};
          boost::asio::post(yield2);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
      };

    count = 0;
    boost::asio::io_context io{};
    ufiber::spawn(io, f);

    BOOST_TEST(io.run() > 0);
    BOOST_TEST(count == 3);

    return boost::report_errors();
}